

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ReturnStatement * __thiscall hdc::Parser::parse_return_statement(Parser *this)

{
  bool bVar1;
  ReturnStatement *this_00;
  Expression *expression;
  Token token;
  
  token.lexem._M_dataplus._M_p = (pointer)&token.lexem.field_2;
  token.lexem._M_string_length = 0;
  token.lexem.field_2._M_local_buf[0] = '\0';
  expect(this,TK_RETURN);
  Token::operator=(&token,(this->matched)._M_current);
  bVar1 = lookahead(this,TK_NEWLINE);
  if (bVar1) {
    this_00 = (ReturnStatement *)operator_new(0x68);
    ReturnStatement::ReturnStatement(this_00,&token);
  }
  else {
    this_00 = (ReturnStatement *)operator_new(0x68);
    expression = parse_assignment_expression(this);
    ReturnStatement::ReturnStatement(this_00,&token,expression);
  }
  expect(this,TK_NEWLINE);
  std::__cxx11::string::~string((string *)&token.lexem);
  return this_00;
}

Assistant:

ReturnStatement* Parser::parse_return_statement() {
    Token token;
    ReturnStatement* ret;

    expect(TK_RETURN);
    token = *matched;

    if (lookahead(TK_NEWLINE)) {
        ret = new ReturnStatement(token);
    } else {
        ret = new ReturnStatement(token, parse_expression());
    }

    expect(TK_NEWLINE);
    return ret;
}